

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

void __thiscall
vkb::detail::GenericFeatureChain::chain_up
          (GenericFeatureChain *this,VkPhysicalDeviceFeatures2 *feats2)

{
  bool bVar1;
  reference pGVar2;
  reference local_58;
  GenericFeaturesPNextNode *extension;
  iterator __end2;
  iterator __begin2;
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  *__range2;
  GenericFeaturesPNextNode *prev;
  VkPhysicalDeviceFeatures2 *feats2_local;
  GenericFeatureChain *this_local;
  
  __range2 = (vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
              *)0x0;
  __end2 = std::
           vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
           ::begin(&this->nodes);
  extension = (GenericFeaturesPNextNode *)
              std::
              vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
              ::end(&this->nodes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
                                *)&extension);
    if (!bVar1) break;
    pGVar2 = __gnu_cxx::
             __normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
             ::operator*(&__end2);
    if (__range2 !=
        (vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
         *)0x0) {
      (__range2->
      super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      )._M_impl.super__Vector_impl_data._M_finish = pGVar2;
    }
    __gnu_cxx::
    __normal_iterator<vkb::detail::GenericFeaturesPNextNode_*,_std::vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>_>
    ::operator++(&__end2);
    __range2 = (vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                *)pGVar2;
  }
  feats2->sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
  bVar1 = std::
          vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
          ::empty(&this->nodes);
  if (bVar1) {
    local_58 = (reference)0x0;
  }
  else {
    local_58 = std::
               vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
               ::at(&this->nodes,0);
  }
  feats2->pNext = local_58;
  return;
}

Assistant:

void GenericFeatureChain::chain_up(VkPhysicalDeviceFeatures2& feats2) noexcept {
    detail::GenericFeaturesPNextNode* prev = nullptr;
    for (auto& extension : nodes) {
        if (prev != nullptr) {
            prev->pNext = &extension;
        }
        prev = &extension;
    }
    feats2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
    feats2.pNext = !nodes.empty() ? &nodes.at(0) : nullptr;
}